

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::BasicCalendarFactory::updateVisibleIDs
          (BasicCalendarFactory *this,Hashtable *result,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString local_100;
  ConstChar16Ptr local_b0;
  UnicodeString local_a8;
  undefined1 local_68 [8];
  UnicodeString id;
  int32_t i;
  UErrorCode *status_local;
  Hashtable *result_local;
  BasicCalendarFactory *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    for (id.fUnion._52_4_ = 0; gCalTypes[(int)id.fUnion._52_4_] != (char *)0x0;
        id.fUnion._52_4_ = id.fUnion._52_4_ + 1) {
      UnicodeString::UnicodeString((UnicodeString *)local_68,L'@');
      ConstChar16Ptr::ConstChar16Ptr(&local_b0,L"calendar=");
      UnicodeString::UnicodeString(&local_a8,'\x01',&local_b0,-1);
      UnicodeString::append((UnicodeString *)local_68,&local_a8);
      UnicodeString::~UnicodeString(&local_a8);
      ConstChar16Ptr::~ConstChar16Ptr(&local_b0);
      UnicodeString::UnicodeString(&local_100,gCalTypes[(int)id.fUnion._52_4_],-1,kInvariant);
      UnicodeString::append((UnicodeString *)local_68,&local_100);
      UnicodeString::~UnicodeString(&local_100);
      Hashtable::put(result,(UnicodeString *)local_68,this,status);
      UnicodeString::~UnicodeString((UnicodeString *)local_68);
    }
  }
  return;
}

Assistant:

virtual void updateVisibleIDs(Hashtable& result, UErrorCode& status) const
    {
        if (U_SUCCESS(status)) {
            for(int32_t i=0;gCalTypes[i] != NULL;i++) {
                UnicodeString id((UChar)0x40); /* '@' a variant character */
                id.append(UNICODE_STRING_SIMPLE("calendar="));
                id.append(UnicodeString(gCalTypes[i], -1, US_INV));
                result.put(id, (void*)this, status);
            }
        }
    }